

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_list.hpp
# Opt level: O2

unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
* __thiscall
gmlc::libguarded::detail::
allocate_unique<gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::node,std::allocator<gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::node>,int&>
          (unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
           *__return_storage_ptr__,detail *this,
          allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node> *alloc,
          int *args)

{
  pointer pnVar1;
  
  pnVar1 = std::
           allocator_traits<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>
           ::allocate((allocator_type *)this,1);
  (pnVar1->next)._M_b._M_p = (__pointer_type)0x0;
  (pnVar1->back)._M_b._M_p = (__pointer_type)0x0;
  pnVar1->deleted = false;
  pnVar1->data = *(int *)alloc;
  (__return_storage_ptr__->_M_t).
  super___uniq_ptr_impl<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
  .
  super__Head_base<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_false>
  ._M_head_impl = pnVar1;
  return __return_storage_ptr__;
}

Assistant:

std::unique_ptr<T, deallocator<Alloc>> allocate_unique(Alloc& alloc,
                                                           Args&&... args)
    {
        using allocator_traits = std::allocator_traits<Alloc>;
        auto p = allocator_traits::allocate(alloc, 1);
        try {
            allocator_traits::construct(alloc, p, std::forward<Args>(args)...);
            return {p, deallocator<Alloc>{alloc}};
        }
        catch (...) {
            allocator_traits::deallocate(alloc, p, 1);
            throw;
        }
    }